

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

_Bool textui_get_item(object **choice,char *pmt,char *str,cmd_code cmd,item_tester tester,
                     wchar_t mode)

{
  uint32_t *puVar1;
  ushort uVar2;
  player_upkeep *ppVar3;
  olist_detail_t oVar4;
  uint uVar5;
  bool bVar6;
  player *ppVar7;
  cmd_code lookup_cmd;
  size_t sVar8;
  _Bool _Var9;
  byte bVar10;
  char cVar11;
  wchar_t wVar12;
  int iVar13;
  uint uVar14;
  object *poVar15;
  size_t sVar16;
  menu *menu;
  ulong uVar17;
  char *pcVar18;
  int iVar19;
  wchar_t wVar20;
  object **ppoVar21;
  long lVar22;
  undefined4 extraout_EDX;
  wchar_t wVar23;
  long lVar24;
  byte bVar25;
  byte bVar26;
  char *pcVar27;
  ulong uVar28;
  byte bVar29;
  uint uVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  ui_event uVar33;
  byte local_10c;
  char local_d8 [80];
  char tmp_val [75];
  
  uVar2 = z_info->floor_size;
  uVar30 = (uint)z_info->pack_size + (uint)uVar2 + (uint)z_info->quiver_size;
  floor_list = (object **)mem_zalloc((ulong)((uint)uVar2 * 8));
  throwing_list = (object **)mem_zalloc((ulong)(uVar30 * 8));
  allow_all = str == (char *)0x0;
  oVar4 = OLIST_FAIL;
  if ((mode & 0x40U) == 0) {
    oVar4 = OLIST_WEIGHT;
  }
  olist_mode = (uint)mode >> 2 & OLIST_RECHARGE |
               (uint)mode >> 6 & OLIST_QUIVER |
               (uint)mode >> 2 & OLIST_SEMPTY | (uint)mode >> 1 & OLIST_PRICE | oVar4;
  item_mode = mode;
  item_cmd = cmd;
  tester_m = tester;
  prompt = pmt;
  event_signal(EVENT_MESSAGE_FLUSH);
  i1 = L'\0';
  i2 = (uint)z_info->pack_size + L'\xffffffff';
  if ((mode & 2U) == 0) {
    i2 = L'\xffffffff';
  }
  while ((i1 <= i2 && (_Var9 = object_test(tester,player->upkeep->inven[i1]), !_Var9))) {
    i1 = i1 + L'\x01';
  }
  while ((i1 <= i2 && (_Var9 = object_test(tester,player->upkeep->inven[i2]), !_Var9))) {
    i2 = i2 + L'\xffffffff';
  }
  bVar26 = 1;
  if ((i2 < i1) && (allow_all == false)) {
    if ((item_mode & 2U) != 0) {
      item_mode = item_mode + L'\xfffffffe';
    }
    bVar26 = 0;
  }
  e1 = L'\0';
  e2 = (uint)(player->body).count + L'\xffffffff';
  local_10c = (byte)mode;
  if ((mode & 1U) == 0) {
    e2 = L'\xffffffff';
  }
  if (cmd != CMD_NULL || tester != (item_tester)0x0) {
    for (; e1 <= e2; e1 = e1 + L'\x01') {
      poVar15 = slot_object(player,e1);
      _Var9 = object_test(tester,poVar15);
      if (_Var9) break;
    }
    do {
      if (e2 < e1) break;
      poVar15 = slot_object(player,e2);
      _Var9 = object_test(tester,poVar15);
      if (_Var9) break;
      e2 = e2 + L'\xffffffff';
    } while( true );
  }
  bVar10 = 1;
  if ((e2 < e1) && (allow_all == false)) {
    if ((item_mode & 1U) != 0) {
      item_mode = item_mode + L'\xffffffff';
    }
    bVar10 = 0;
  }
  q1 = L'\0';
  q2 = (uint)z_info->quiver_size + L'\xffffffff';
  if ((mode & 8U) == 0) {
    q2 = L'\xffffffff';
  }
  while ((q1 <= q2 && (_Var9 = object_test(tester,player->upkeep->quiver[q1]), !_Var9))) {
    q1 = q1 + L'\x01';
  }
  while ((q1 <= q2 && (_Var9 = object_test(tester,player->upkeep->quiver[q2]), !_Var9))) {
    q2 = q2 + L'\xffffffff';
  }
  bVar25 = 1;
  if ((q2 < q1) && (allow_all == false)) {
    if ((item_mode & 8U) != 0) {
      item_mode = item_mode + L'\xfffffff8';
    }
    bVar25 = 0;
  }
  wVar12 = scan_floor(floor_list,(uint)uVar2,player,OFLOOR_VISIBLE|OFLOOR_SENSE|OFLOOR_TEST,tester);
  f1 = L'\0';
  f2 = L'\xffffffff';
  if ((mode & 4U) != 0) {
    f2 = wVar12 + L'\xffffffff';
  }
  while ((f1 <= f2 && (_Var9 = object_test(tester,floor_list[f1]), !_Var9))) {
    f1 = f1 + L'\x01';
  }
  while ((f1 <= f2 && (_Var9 = object_test(tester,floor_list[f2]), !_Var9))) {
    f2 = f2 + L'\xffffffff';
  }
  bVar29 = 1;
  if ((f2 < f1) && (allow_all == false)) {
    if ((item_mode & 4U) != 0) {
      item_mode = item_mode + L'\xfffffffc';
    }
    bVar29 = 0;
  }
  throwing_num = scan_items(throwing_list,(ulong)uVar30,player,L'\x0e',obj_is_throwing);
  if ((byte)(bVar26 | bVar10 | bVar25 | bVar29) == 1) {
    if ((((uint)mode >> 0xb & 1) == 0) || (wVar12 = L'ࠀ', throwing_num == L'\0')) {
      wVar20 = player->upkeep->command_wrk;
      wVar12 = L'\x01';
      if (((((bVar10 & wVar20 == L'\x01') == 0) &&
           ((((wVar12 = L'\x02', (bVar26 & wVar20 == L'\x02') == 0 &&
              (wVar12 = L'\b', (bVar25 & wVar20 == L'\b') == 0)) &&
             (wVar12 = L'\x04', (bVar29 & wVar20 == L'\x04') == 0)) &&
            ((wVar12 = L'\b', (cmd != CMD_USE & (byte)((uint)mode >> 9) & bVar25) == 0 &&
             (wVar12 = L'\x02', (local_10c >> 1 & bVar26) == 0)))))) &&
          (wVar12 = L'\x01', (local_10c & bVar10) == 0)) &&
         (wVar12 = L'\b', (local_10c >> 3 & bVar25) == 0)) {
        wVar12 = L'\x02';
        if ((mode & 4U) != 0) {
          wVar12 = (uint)bVar29 * 2 + L'\x02';
        }
      }
    }
    player->upkeep->command_wrk = wVar12;
    bVar6 = false;
    do {
      iVar13 = 0;
      iVar19 = 0;
      for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
        if (angband_term[lVar24] != (term *)0x0) {
          iVar13 = iVar13 + (window_flag[lVar24] & 1);
          iVar19 = iVar19 + (uint)((window_flag[lVar24] >> 1 & 1) != 0);
        }
      }
      if ((iVar13 != 0) != (iVar19 != 0)) {
        wVar12 = player->upkeep->command_wrk;
        if (wVar12 == L'\x02') {
          bVar31 = iVar13 == 0;
          iVar13 = iVar19;
          if (bVar31) {
joined_r0x001e8d74:
            if ((iVar13 == 0) || (!bVar6)) goto LAB_001e8da2;
          }
          else {
joined_r0x001e8d70:
            if (bVar6) goto joined_r0x001e8d74;
          }
          toggle_inven_equip();
          bVar6 = (bool)(bVar6 ^ 1);
        }
        else {
          if (wVar12 == L'\x01') {
            if (iVar19 != 0) goto joined_r0x001e8d70;
            goto joined_r0x001e8d74;
          }
          if (bVar6) {
            toggle_inven_equip();
            bVar6 = false;
          }
        }
      }
LAB_001e8da2:
      ppVar7 = player;
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x60000;
      redraw_stuff(ppVar7);
      screen_save();
      wipe_obj_list();
      ppVar3 = player->upkeep;
      switch(ppVar3->command_wrk) {
      case L'\x01':
        ppoVar21 = (object **)0x0;
        wVar12 = e2;
        break;
      case L'\x02':
        ppoVar21 = ppVar3->inven;
        wVar12 = i2;
        break;
      case L'\x03':
      case L'\x05':
      case L'\x06':
      case L'\a':
        goto switchD_001e8de5_caseD_3;
      case L'\x04':
        ppoVar21 = floor_list;
        wVar12 = f2;
        break;
      case L'\b':
        ppoVar21 = ppVar3->quiver;
        wVar12 = q2;
        break;
      default:
        ppoVar21 = throwing_list;
        wVar12 = throwing_num;
        if (ppVar3->command_wrk == L'ࠀ') break;
        goto switchD_001e8de5_caseD_3;
      }
      build_obj_list(wVar12,ppoVar21,tester_m,olist_mode);
switchD_001e8de5_caseD_3:
      _Var9 = allow_all;
      wVar20 = item_mode;
      bVar31 = f2 < f1;
      wVar12 = player->upkeep->command_wrk;
      if (wVar12 == L'\x01') {
        strnfmt(local_d8,0x4b,"Equip:");
        if (e1 <= e2) {
          strnfmt(tmp_val,0x4b," %c-%c,",
                  (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[e1],
                  (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[e2]);
          my_strcat(local_d8,tmp_val,0x4b);
        }
        if ((wVar20 & 2U) != 0) {
          pcVar27 = " / for Inven,";
LAB_001e90a7:
          my_strcat(local_d8,pcVar27,0x4b);
        }
joined_r0x001e8fa4:
        if ((wVar20 & 8U) != 0) {
          my_strcat(local_d8," | for Quiver,",0x4b);
        }
        pcVar27 = " - for floor,";
        if (!bVar31 || (_Var9 & 1U) != 0) {
LAB_001e90e1:
          my_strcat(local_d8,pcVar27,0x4b);
        }
      }
      else {
        if (wVar12 == L'ࠀ') {
          strnfmt(local_d8,0x4b,"Throwing items:");
          if ((long)throwing_num != 0) {
            strnfmt(tmp_val,0x4b," a-%c,",(ulong)(uint)(int)(char)(&DAT_0022f31f)[throwing_num]);
            my_strcat(local_d8,tmp_val,0x4b);
          }
          if ((wVar20 & 2U) != 0) {
            my_strcat(local_d8," / for Inven,",0x4b);
          }
          goto joined_r0x001e8fa4;
        }
        if (wVar12 == L'\b') {
          strnfmt(local_d8,0x4b,"Quiver:");
          if (q1 <= q2) {
            strnfmt(tmp_val,0x4b," %d-%d,");
            my_strcat(local_d8,tmp_val,0x4b);
          }
          if ((wVar20 & 3U) != 0) {
            pcVar27 = " / for Inven,";
            if ((wVar20 & 2U) == 0) {
              pcVar27 = " / for Equip,";
            }
            my_strcat(local_d8,pcVar27,0x4b);
          }
          pcVar27 = " - for floor,";
          bVar31 = bVar31 && (_Var9 & 1U) == 0;
        }
        else {
          if (wVar12 == L'\x02') {
            strnfmt(local_d8,0x4b,"Inven:");
            if (i1 <= i2) {
              strnfmt(tmp_val,0x4b," %c-%c,",
                      (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i1],
                      (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i2]);
              my_strcat(local_d8,tmp_val,0x4b);
            }
            if ((wVar20 & 1U) != 0) {
              pcVar27 = " / for Equip,";
              goto LAB_001e90a7;
            }
            goto joined_r0x001e8fa4;
          }
          strnfmt(local_d8,0x4b,"Floor:");
          if (f1 <= f2) {
            strnfmt(tmp_val,0x4b," %c-%c,",
                    (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[f1],
                    (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[f2]);
            my_strcat(local_d8,tmp_val,0x4b);
          }
          if ((wVar20 & 3U) != 0) {
            pcVar27 = " / for Inven,";
            if ((wVar20 & 2U) == 0) {
              pcVar27 = " / for Equip,";
            }
            my_strcat(local_d8,pcVar27,0x4b);
          }
          pcVar27 = " | for Quiver,";
          bVar31 = (wVar20 & 8U) == 0;
        }
        if (!bVar31) goto LAB_001e90e1;
      }
      my_strcat(local_d8," ESC",0x4b);
      strnfmt(header,0x50,"(%s)",local_d8);
      wVar12 = L'\r';
      if (pmt != (char *)0x0) {
        prt(pmt,L'\0',L'\0');
        sVar16 = strlen(pmt);
        prt(header,L'\0',(int)sVar16 + L'\x01');
        sVar16 = strlen(pmt);
        iVar13 = (int)sVar16;
        if (sVar16 < 0x10) {
          iVar13 = 0xf;
        }
        wVar12 = iVar13 + L'\xfffffffe';
      }
      newmenu = '\0';
      tmp_val[0x20] = '\0';
      tmp_val[0x21] = '\0';
      tmp_val[0x22] = '\0';
      tmp_val[0x23] = '\0';
      tmp_val[0x24] = '\0';
      tmp_val[0x25] = '\0';
      tmp_val[0x26] = '\0';
      tmp_val[0x27] = '\0';
      tmp_val._16_8_ = get_item_display;
      tmp_val._24_8_ = get_item_action;
      tmp_val._0_8_ = get_item_tag;
      tmp_val._8_8_ = get_item_validity;
      menu = (menu *)menu_new(MN_SKIN_OBJECT,(menu_iter *)tmp_val);
      menu_setpriv((menu_conflict *)menu,num_obj,items);
      pcVar27 = "0123456789";
      if (player->upkeep->command_wrk != L'\b') {
        pcVar27 = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
      }
      menu->selections = pcVar27;
      menu->switch_keys = "/|-";
      menu->context_hook = use_context_menu_list_switcher;
      menu->flags = L'D';
      menu->browse_hook = item_menu_browser;
      pcVar27 = (char *)mem_zalloc(10);
      menu->inscriptions = pcVar27;
      for (lVar24 = 0; lookup_cmd = item_cmd, lVar24 != 10; lVar24 = lVar24 + 1) {
        bVar26 = (byte)lVar24 | 0x30;
        _Var9 = (player->opts).opt[1];
        if (((item_mode & 0x200U) == 0) ||
           (poVar15 = player->upkeep->quiver[(ulong)bVar26 - 0x30], poVar15 == (object *)0x0)) {
          for (lVar22 = 0; lVar22 < num_obj; lVar22 = lVar22 + 1) {
            poVar15 = items[lVar22].object;
            if ((poVar15 != (object *)0x0) && (poVar15->note != 0)) {
              pcVar27 = quark_str(poVar15->note);
              while (pcVar18 = strchr(pcVar27,0x40), pcVar18 != (char *)0x0) {
                if (pcVar18[1] == bVar26) goto LAB_001e9267;
                pcVar27 = pcVar18 + 1;
                bVar10 = cmd_lookup_key_unktrl(lookup_cmd,(uint)_Var9);
                if (((int)*pcVar27 == (uint)bVar10) && (pcVar18[2] == bVar26)) goto LAB_001e9267;
              }
            }
          }
        }
        else {
LAB_001e9267:
          uVar17 = (ulong)(uint)num_obj;
          if (num_obj < L'\x01') {
            uVar17 = 0;
          }
          ppoVar21 = &items[0].object;
          for (uVar28 = 0; uVar17 != uVar28; uVar28 = uVar28 + 1) {
            if (*ppoVar21 == poVar15) {
              cVar11 = get_item_tag(menu,(wchar_t)uVar28);
              menu->inscriptions[lVar24] = cVar11;
              break;
            }
            ppoVar21 = ppoVar21 + 0x20;
          }
        }
      }
      selection = (object *)0x0;
      set_obj_names(false,player);
      if ((((mode & 2U) != 0) && (*player->upkeep->quiver != (object *)0x0)) && (max_len < 0x19)) {
        max_len = 0x18;
      }
      auVar32._0_4_ = -(uint)((olist_mode & (OLIST_FAIL|OLIST_PRICE|OLIST_WEIGHT)) == OLIST_NONE);
      auVar32._4_4_ = -(uint)((olist_mode & OLIST_FAIL) == OLIST_NONE);
      auVar32._8_4_ = -(uint)((olist_mode & OLIST_PRICE) == OLIST_NONE);
      auVar32._12_4_ = -(uint)((olist_mode & OLIST_WEIGHT) == OLIST_NONE);
      uVar30 = movmskps(extraout_EDX,auVar32);
      bVar31 = (uVar30 & 8) == 0;
      wVar20 = ex_width + L'\t';
      if (!bVar31) {
        wVar20 = ex_width;
      }
      uVar5 = (uint)bVar31 * 9 + 9;
      wVar23 = wVar20 + L'\t';
      if ((uVar30 & 4) != 0) {
        uVar5 = (uint)bVar31 * 9;
        wVar23 = wVar20;
      }
      bVar31 = (uVar30 & 2) != 0;
      wVar20 = wVar23 + L'\n';
      if (bVar31) {
        wVar20 = wVar23;
      }
      uVar14 = uVar5 + 10;
      if (bVar31) {
        uVar14 = uVar5;
      }
      if ((uVar30 & 1) == 0) {
        ex_width = wVar20;
      }
      area.page_rows = menu->count;
      area.row = L'\x01';
      area.col = (Term->wid - wVar20) + ~(wchar_t)max_len;
      if (wVar12 <= area.col) {
        area.col = wVar12;
      }
      if (area.col < L'\x04') {
        area.col = L'\0';
      }
      ex_offset = (~wVar20 + Term->wid) - area.col;
      if (max_len <= (ulong)(long)ex_offset) {
        ex_offset = (wchar_t)max_len;
      }
      do {
        sVar16 = strlen(header);
        if ((long)ex_width + max_len + (ulong)uVar14 <= sVar16) break;
        my_strcat(header," ",0x50);
        sVar16 = strlen(header);
      } while (sVar16 < 0x4f);
      sVar8 = max_len;
      sVar16 = strlen(header);
      if (sVar16 < sVar8) {
        sVar16 = sVar8;
      }
      area.width = (wchar_t)sVar16;
      for (wVar12 = area.row; wVar20 = L'\x01', wVar12 < area.row + area.page_rows;
          wVar12 = wVar12 + L'\x01') {
        wVar23 = area.col;
        if (area.col < L'\x02') {
          wVar23 = wVar20;
        }
        prt("",wVar12,wVar23 + L'\xffffffff');
      }
      menu_layout((menu_conflict *)menu,(region_conflict *)&area);
      uVar33 = menu_select((menu_conflict *)menu,0,true);
      mem_free(menu->inscriptions);
      mem_free(menu);
      if ((uVar33.type != EVT_SWITCH) || (newmenu != '\0')) goto LAB_001e9851;
      uVar17 = (ulong)uVar33.mouse & 0xffffffff00000000;
      wVar12 = player->upkeep->command_wrk;
      switch(wVar12) {
      case L'\x01':
        if (uVar17 == 0x8100000000) {
          wVar12 = L'\x04';
          if ((f2 < f1) && (wVar12 = L'\b', q2 < q1)) {
LAB_001e9801:
            wVar12 = L'\x02';
            if (i2 < i1) break;
          }
        }
        else {
          wVar12 = L'\x02';
          if ((i2 < i1) && (wVar12 = L'\b', q2 < q1)) {
LAB_001e9836:
            wVar12 = L'\x04';
            if (f2 < f1) break;
          }
        }
        goto LAB_001e9847;
      case L'\x02':
        if (uVar17 == 0x8100000000) {
          wVar12 = wVar20;
          if ((e1 <= e2) || (wVar12 = L'\x04', f1 <= f2)) goto LAB_001e9847;
LAB_001e978e:
          wVar12 = L'\b';
          if (q1 <= q2) goto LAB_001e9847;
        }
        else {
          wVar12 = L'\b';
          if ((q1 <= q2) || (wVar12 = L'\x04', f1 <= f2)) goto LAB_001e9847;
LAB_001e97ce:
          wVar12 = L'\x01';
          if (e1 <= e2) goto LAB_001e9847;
        }
        break;
      case L'\x03':
      case L'\x05':
      case L'\x06':
      case L'\a':
        break;
      case L'\x04':
switchD_001e95b1_caseD_4:
        if (uVar17 == 0x8100000000) {
          wVar12 = L'\b';
          if ((q2 < q1) && (wVar12 = L'\x02', i2 < i1)) goto LAB_001e97ce;
        }
        else {
          wVar12 = L'\x01';
          if ((e2 < e1) && (wVar12 = L'\x02', i2 < i1)) goto LAB_001e978e;
        }
        goto LAB_001e9847;
      case L'\b':
        if (uVar17 == 0x8100000000) {
          wVar12 = L'\x02';
          if ((i2 < i1) && (wVar12 = wVar20, e2 < e1)) goto LAB_001e9836;
        }
        else {
          wVar12 = L'\x04';
          if ((f2 < f1) && (wVar12 = wVar20, e2 < e1)) goto LAB_001e9801;
        }
LAB_001e9847:
        player->upkeep->command_wrk = wVar12;
        break;
      default:
        if (wVar12 == L'ࠀ') goto switchD_001e95b1_caseD_4;
      }
      newmenu = '\x01';
LAB_001e9851:
      *choice = selection;
      screen_load();
      ppVar7 = player;
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x60000;
      redraw_stuff(ppVar7);
      prt("",L'\0',L'\0');
    } while ((*choice == (object *)0x0) && (newmenu != '\0'));
    if (bVar6) {
      toggle_inven_equip();
    }
  }
  else {
    if (str != (char *)0x0) {
      msg("%s");
    }
    *choice = (object *)0x0;
  }
  player->upkeep->command_wrk = L'\0';
  mem_free(throwing_list);
  mem_free(floor_list);
  return *choice != (object *)0x0;
}

Assistant:

bool textui_get_item(struct object **choice, const char *pmt, const char *str,
					 cmd_code cmd, item_tester tester, int mode)
{
	bool use_inven = ((mode & USE_INVEN) ? true : false);
	bool use_equip = ((mode & USE_EQUIP) ? true : false);
	bool use_quiver = ((mode & USE_QUIVER) ? true : false);
	bool use_floor = ((mode & USE_FLOOR) ? true : false);
	bool quiver_tags = ((mode & QUIVER_TAGS) ? true : false);
	bool show_throwing = ((mode & SHOW_THROWING) ? true : false);

	bool allow_inven = false;
	bool allow_equip = false;
	bool allow_quiver = false;
	bool allow_floor = false;

	bool toggle = false;

	int floor_max = z_info->floor_size;
	int floor_num;

	int throwing_max = z_info->pack_size + z_info->quiver_size +
		z_info->floor_size;

	floor_list = mem_zalloc(floor_max * sizeof(*floor_list));
	throwing_list = mem_zalloc(throwing_max * sizeof(*throwing_list));
	olist_mode = 0;
	item_mode = mode;
	item_cmd = cmd;
	tester_m = tester;
	prompt = pmt;
	allow_all = str ? false : true;

	/* Object list display modes */
	if (mode & SHOW_FAIL)
		olist_mode |= OLIST_FAIL;
	else
		olist_mode |= OLIST_WEIGHT;

	if (mode & SHOW_PRICES)
		olist_mode |= OLIST_PRICE;

	if (mode & SHOW_EMPTY)
		olist_mode |= OLIST_SEMPTY;

	if (mode & SHOW_QUIVER)
		olist_mode |= OLIST_QUIVER;

	if (mode & SHOW_RECHARGE)
		olist_mode |= OLIST_RECHARGE;

	/* Paranoia XXX XXX XXX */
	event_signal(EVENT_MESSAGE_FLUSH);

	/* Full inventory */
	i1 = 0;
	i2 = z_info->pack_size - 1;

	/* Forbid inventory */
	if (!use_inven) i2 = -1;

	/* Restrict inventory indexes */
	while ((i1 <= i2) && (!object_test(tester, player->upkeep->inven[i1])))
		i1++;
	while ((i1 <= i2) && (!object_test(tester, player->upkeep->inven[i2])))
		i2--;

	/* Accept inventory */
	if ((i1 <= i2) || allow_all)
		allow_inven = true;
	else if (item_mode & USE_INVEN)
		item_mode -= USE_INVEN;

	/* Full equipment */
	e1 = 0;
	e2 = player->body.count - 1;

	/* Forbid equipment */
	if (!use_equip) e2 = -1;

	/* Restrict equipment indexes unless starting with no command */
	if ((cmd != CMD_NULL) || (tester != NULL)) {
		while ((e1 <= e2) && (!object_test(tester, slot_object(player, e1))))
			e1++;
		while ((e1 <= e2) && (!object_test(tester, slot_object(player, e2))))
			e2--;
	}

	/* Accept equipment */
	if ((e1 <= e2) || allow_all)
		allow_equip = true;
	else if (item_mode & USE_EQUIP)
		item_mode -= USE_EQUIP;

	/* Restrict quiver indexes */
	q1 = 0;
	q2 = z_info->quiver_size - 1;

	/* Forbid quiver */
	if (!use_quiver) q2 = -1;

	/* Restrict quiver indexes */
	while ((q1 <= q2) && (!object_test(tester, player->upkeep->quiver[q1])))
		q1++;
	while ((q1 <= q2) && (!object_test(tester, player->upkeep->quiver[q2])))
		q2--;

	/* Accept quiver */
	if ((q1 <= q2) || allow_all)
		allow_quiver = true;
	else if (item_mode & USE_QUIVER)
		item_mode -= USE_QUIVER;

	/* Scan all non-gold objects in the grid */
	floor_num = scan_floor(floor_list, floor_max, player,
		OFLOOR_TEST | OFLOOR_SENSE | OFLOOR_VISIBLE, tester);

	/* Full floor */
	f1 = 0;
	f2 = floor_num - 1;

	/* Forbid floor */
	if (!use_floor) f2 = -1;

	/* Restrict floor indexes */
	while ((f1 <= f2) && (!object_test(tester, floor_list[f1]))) f1++;
	while ((f1 <= f2) && (!object_test(tester, floor_list[f2]))) f2--;

	/* Accept floor */
	if ((f1 <= f2) || allow_all)
		allow_floor = true;
	else if (item_mode & USE_FLOOR)
		item_mode -= USE_FLOOR;

	/* Scan all throwing objects in reach */
	throwing_num = scan_items(throwing_list, throwing_max, player,
		USE_INVEN | USE_QUIVER | USE_FLOOR, obj_is_throwing);

	/* Require at least one legal choice */
	if (allow_inven || allow_equip || allow_quiver || allow_floor) {
		/* Use throwing menu if at all possible */
		if (show_throwing && throwing_num) {
			player->upkeep->command_wrk = SHOW_THROWING;

			/* Start where requested if possible */
		} else if ((player->upkeep->command_wrk == USE_EQUIP) && allow_equip)
			player->upkeep->command_wrk = USE_EQUIP;
		else if ((player->upkeep->command_wrk == USE_INVEN) && allow_inven)
			player->upkeep->command_wrk = USE_INVEN;
		else if ((player->upkeep->command_wrk == USE_QUIVER) && allow_quiver)
			player->upkeep->command_wrk = USE_QUIVER;
		else if ((player->upkeep->command_wrk == USE_FLOOR) && allow_floor)
			player->upkeep->command_wrk = USE_FLOOR;

		/* If we are obviously using the quiver then start on quiver */
		else if (quiver_tags && allow_quiver && (cmd != CMD_USE))
			player->upkeep->command_wrk = USE_QUIVER;

		/* Otherwise choose whatever is allowed */
		else if (use_inven && allow_inven)
			player->upkeep->command_wrk = USE_INVEN;
		else if (use_equip && allow_equip)
			player->upkeep->command_wrk = USE_EQUIP;
		else if (use_quiver && allow_quiver)
			player->upkeep->command_wrk = USE_QUIVER;
		else if (use_floor && allow_floor)
			player->upkeep->command_wrk = USE_FLOOR;

		/* If nothing to choose, use (empty) inventory */
		else
			player->upkeep->command_wrk = USE_INVEN;

		while (true) {
			int j;
			int ni = 0;
			int ne = 0;

			/* If inven or equip is on the main screen, and only one of them
			 * is slated for a subwindow, we should show the opposite there */
			for (j = 0; j < ANGBAND_TERM_MAX; j++) {
				/* Unused */
				if (!angband_term[j]) continue;

				/* Count windows displaying inven */
				if (window_flag[j] & (PW_INVEN)) ni++;

				/* Count windows displaying equip */
				if (window_flag[j] & (PW_EQUIP)) ne++;
			}

			/* Are we in the situation where toggling makes sense? */
			if ((ni && !ne) || (!ni && ne)) {
				if (player->upkeep->command_wrk == USE_EQUIP) {
					if ((ne && !toggle) || (ni && toggle)) {
						/* Main screen is equipment, so is subwindow */
						toggle_inven_equip();
						toggle = !toggle;
					}
				} else if (player->upkeep->command_wrk == USE_INVEN) {
					if ((ni && !toggle) || (ne && toggle)) {
						/* Main screen is inventory, so is subwindow */
						toggle_inven_equip();
						toggle = !toggle;
					}
				} else {
					/* Quiver or floor, go back to the original */
					if (toggle) {
						toggle_inven_equip();
						toggle = !toggle;
					}
				}
			}

			/* Redraw */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

			/* Redraw windows */
			redraw_stuff(player);

			/* Save screen */
			screen_save();

			/* Build object list */
			wipe_obj_list();
			if (player->upkeep->command_wrk == USE_INVEN)
				build_obj_list(i2, player->upkeep->inven, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == USE_EQUIP)
				build_obj_list(e2, NULL, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == USE_QUIVER)
				build_obj_list(q2, player->upkeep->quiver, tester_m,olist_mode);
			else if (player->upkeep->command_wrk == USE_FLOOR)
				build_obj_list(f2, floor_list, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == SHOW_THROWING)
				build_obj_list(throwing_num, throwing_list, tester_m,
							   olist_mode);

			/* Show the prompt */
			menu_header();
			if (pmt) {
				prt(pmt, 0, 0);
				prt(header, 0, strlen(pmt) + 1);
			}

			/* No menu change request */
			newmenu = false;

			/* Get an item choice */
			*choice = item_menu(cmd, MAX(pmt ? strlen(pmt) : 0, 15), mode);

			/* Fix the screen */
			screen_load();

			/* Update */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
			redraw_stuff(player);

			/* Clear the prompt line */
			prt("", 0, 0);

			/* We have a selection, or are backing out */
			if (*choice || !newmenu) {
				if (toggle) toggle_inven_equip();
				break;
			}
		}
	} else {
		/* Warning if needed */
		if (str) msg("%s", str);
		*choice = NULL;
	}

	/* Clean up */
	player->upkeep->command_wrk = 0;
	mem_free(throwing_list);
	mem_free(floor_list);

	/* Result */
	return (*choice != NULL) ? true : false;
}